

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O0

void __thiscall
charls::
jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::decoder_strategy>
::reset_parameters(jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::decoder_strategy>
                   *this)

{
  reference pvVar1;
  context_run_mode local_58;
  context_run_mode local_4c;
  iterator local_40;
  value_type *context;
  iterator __end2;
  iterator __begin2;
  array<charls::context_regular_mode,_365UL> *__range2;
  context_regular_mode context_initial_value;
  jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::decoder_strategy>
  *this_local;
  
  context_initial_value._8_8_ = this;
  context_regular_mode::context_regular_mode
            ((context_regular_mode *)&__range2,(this->traits_).range);
  __begin2 = (this->contexts_)._M_elems;
  __end2 = std::array<charls::context_regular_mode,_365UL>::begin
                     ((array<charls::context_regular_mode,_365UL> *)__begin2);
  context = std::array<charls::context_regular_mode,_365UL>::end
                      ((array<charls::context_regular_mode,_365UL> *)__begin2);
  for (; __end2 != context; __end2 = __end2 + 1) {
    local_40 = __end2;
    *(array<charls::context_regular_mode,_365UL> **)__end2 = __range2;
    local_40->c_ = context_initial_value.a_;
    local_40->n_ = context_initial_value.b_;
  }
  context_run_mode::context_run_mode(&local_4c,0,(this->traits_).range);
  pvVar1 = std::array<charls::context_run_mode,_2UL>::operator[](&this->context_run_mode_,0);
  pvVar1->run_interruption_type_ = local_4c.run_interruption_type_;
  pvVar1->a_ = local_4c.a_;
  pvVar1->n_ = local_4c.n_;
  pvVar1->nn_ = local_4c.nn_;
  context_run_mode::context_run_mode(&local_58,1,(this->traits_).range);
  pvVar1 = std::array<charls::context_run_mode,_2UL>::operator[](&this->context_run_mode_,1);
  pvVar1->run_interruption_type_ = local_58.run_interruption_type_;
  pvVar1->a_ = local_58.a_;
  pvVar1->n_ = local_58.n_;
  pvVar1->nn_ = local_58.nn_;
  this->run_index_ = 0;
  return;
}

Assistant:

void reset_parameters() noexcept
    {
        const context_regular_mode context_initial_value(traits_.range);
        for (auto& context : contexts_)
        {
            context = context_initial_value;
        }

        context_run_mode_[0] = context_run_mode(0, traits_.range);
        context_run_mode_[1] = context_run_mode(1, traits_.range);
        run_index_ = 0;
    }